

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

void Excel::Parser::loadSheet
               (size_t sheetIdx,BoundSheet *boundSheet,Stream *stream,IStorage *storage)

{
  bool bVar1;
  uint16_t uVar2;
  int32_t iVar3;
  BiffVersion BVar4;
  undefined8 uVar5;
  uint uVar6;
  long *in_RDX;
  BoundSheet *in_RSI;
  Record record_1;
  Record record;
  BOF bof;
  Record *in_stack_fffffffffffffbc0;
  allocator *paVar7;
  wstring *in_stack_fffffffffffffbc8;
  Record *this;
  undefined4 in_stack_fffffffffffffbd0;
  undefined4 in_stack_fffffffffffffbd4;
  Record *in_stack_fffffffffffffbd8;
  Record *in_stack_fffffffffffffbe0;
  Record *record_00;
  undefined1 *sheetIdx_00;
  undefined6 in_stack_fffffffffffffc00;
  undefined1 in_stack_fffffffffffffc06;
  allocator in_stack_fffffffffffffc07;
  size_t in_stack_fffffffffffffc08;
  Record *in_stack_fffffffffffffc10;
  Record local_3d0;
  undefined1 local_212;
  allocator local_211;
  wstring local_210 [24];
  IStorage *in_stack_fffffffffffffe08;
  size_t in_stack_fffffffffffffe10;
  Stream *in_stack_fffffffffffffe18;
  Record *in_stack_fffffffffffffe20;
  
  iVar3 = BoundSheet::BOFPosition(in_RSI);
  (**(code **)(*in_RDX + 0x20))(in_RDX,iVar3,0);
  record_00 = (Record *)&stack0xffffffffffffffd8;
  BOF::BOF((BOF *)record_00);
  sheetIdx_00 = &stack0xfffffffffffffe20;
  Record::Record(in_stack_fffffffffffffbe0,(Stream *)in_stack_fffffffffffffbd8);
  BOF::parse((BOF *)in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
  Record::~Record(in_stack_fffffffffffffbc0);
  BVar4 = BOF::version((BOF *)&stack0xffffffffffffffd8);
  if (BVar4 != BIFF8) {
    local_212 = 1;
    uVar5 = __cxa_allocate_exception(0x30);
    paVar7 = &local_211;
    std::allocator<wchar_t>::allocator();
    std::__cxx11::wstring::wstring
              (local_210,L"Unsupported BIFF version. BIFF8 is supported only.",paVar7);
    Exception::Exception
              ((Exception *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
               in_stack_fffffffffffffbc8);
    local_212 = 0;
    __cxa_throw(uVar5,&Exception::typeinfo,Exception::~Exception);
  }
  do {
    this = &local_3d0;
    Record::Record(in_stack_fffffffffffffbe0,(Stream *)in_stack_fffffffffffffbd8);
    uVar2 = Record::code(this);
    uVar6 = (uint)uVar2;
    if (uVar2 == 6) {
      handleFORMULA(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                    in_stack_fffffffffffffe08);
LAB_001146cb:
      bVar1 = false;
    }
    else {
      if (uVar6 != 10) {
        if (uVar6 == 0x7e) {
LAB_00114573:
          handleRK(record_00,(size_t)in_RDX,(IStorage *)in_stack_fffffffffffffbe0);
        }
        else if (uVar6 == 0xbd) {
          handleMULRK((Record *)
                      CONCAT17(in_stack_fffffffffffffc07,
                               CONCAT16(in_stack_fffffffffffffc06,in_stack_fffffffffffffc00)),
                      (size_t)sheetIdx_00,(IStorage *)record_00);
        }
        else if (uVar6 == 0xfd) {
          handleLabelSST((Record *)(ulong)CONCAT24(uVar2,in_stack_fffffffffffffbd0),(size_t)this,
                         (IStorage *)in_stack_fffffffffffffbc0);
        }
        else if (uVar6 == 0x203) {
          handleNUMBER((Record *)(ulong)CONCAT24(uVar2,in_stack_fffffffffffffbd0),(size_t)this,
                       (IStorage *)in_stack_fffffffffffffbc0);
        }
        else if (uVar6 == 0x204) {
          handleLabel(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,
                      (IStorage *)
                      CONCAT17(in_stack_fffffffffffffc07,
                               CONCAT16(in_stack_fffffffffffffc06,in_stack_fffffffffffffc00)));
        }
        else {
          if (uVar6 == 0x27e) goto LAB_00114573;
          if (uVar6 == 0xffff) {
            uVar5 = __cxa_allocate_exception(0x30);
            paVar7 = (allocator *)&stack0xfffffffffffffc07;
            std::allocator<wchar_t>::allocator();
            std::__cxx11::wstring::wstring
                      ((wstring *)&stack0xfffffffffffffc08,L"Wrong format.",paVar7);
            Exception::Exception
                      ((Exception *)CONCAT44(uVar6,in_stack_fffffffffffffbd0),(wstring *)this);
            __cxa_throw(uVar5,&Exception::typeinfo,Exception::~Exception);
          }
        }
        goto LAB_001146cb;
      }
      bVar1 = true;
    }
    Record::~Record(in_stack_fffffffffffffbc0);
    if (bVar1) {
      return;
    }
  } while( true );
}

Assistant:

inline void
Parser::loadSheet( size_t sheetIdx, const BoundSheet & boundSheet,
	Stream & stream, IStorage & storage )
{
	stream.seek( boundSheet.BOFPosition(), Stream::FromBeginning );
	BOF bof;

	{
		Record record( stream );

		bof.parse( record );
	}

	if( bof.version() != BOF::BIFF8 )
		throw Exception( L"Unsupported BIFF version. BIFF8 is supported only." );

	while( true )
	{
		Record record( stream );

		switch( record.code() )
		{
			case XL_LABELSST :
				handleLabelSST( record, sheetIdx, storage );
				break;

			case XL_LABEL :
				handleLabel( record, sheetIdx, storage );
				break;

			case XL_RK :
			case XL_RK2 :
				handleRK( record, sheetIdx, storage );
				break;

			case XL_MULRK :
				handleMULRK( record, sheetIdx, storage );
				break;

			case XL_NUMBER :
				handleNUMBER( record, sheetIdx, storage );
				break;

			case XL_FORMULA :
				handleFORMULA( record, stream, sheetIdx, storage );
				break;

			case XL_EOF :
				return;

			case XL_UNKNOWN :
				throw Exception( L"Wrong format." );

			default:
				break;
		}
	}
}